

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

long __thiscall
duckdb::Interpolator<true>::Operation<long,long,duckdb::QuantileDirect<long>>
          (Interpolator<true> *this,long *v_t,Vector *result,QuantileDirect<long> *accessor)

{
  bool bVar1;
  duckdb *this_00;
  undefined1 auVar2 [16];
  long result_1;
  long local_40;
  string local_38;
  
  this_00 = (duckdb *)InterpolateInternal<long,duckdb::QuantileDirect<long>>(this,v_t,accessor);
  bVar1 = TryCast::Operation<long,long>((int64_t)this_00,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,long>(&local_38,this_00,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}